

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O1

void AddVectorEq_SSE2(uint32_t *a,uint32_t *out,int size)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  uint32_t uVar31;
  uint32_t uVar32;
  uint32_t uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  
  uVar35 = 0;
  if (0xf < size) {
    uVar34 = 0;
    do {
      puVar1 = a + uVar34;
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      puVar2 = a + uVar34 + 4;
      uVar7 = *puVar2;
      uVar8 = puVar2[1];
      uVar9 = puVar2[2];
      uVar10 = puVar2[3];
      puVar2 = a + uVar34 + 8;
      uVar11 = *puVar2;
      uVar12 = puVar2[1];
      uVar13 = puVar2[2];
      uVar14 = puVar2[3];
      puVar2 = a + uVar34 + 0xc;
      uVar15 = *puVar2;
      uVar16 = puVar2[1];
      uVar17 = puVar2[2];
      uVar18 = puVar2[3];
      puVar2 = out + uVar34;
      uVar19 = puVar2[1];
      uVar20 = puVar2[2];
      uVar21 = puVar2[3];
      puVar3 = out + uVar34 + 4;
      uVar22 = *puVar3;
      uVar23 = puVar3[1];
      uVar24 = puVar3[2];
      uVar25 = puVar3[3];
      puVar3 = out + uVar34 + 8;
      uVar26 = *puVar3;
      uVar27 = puVar3[1];
      uVar28 = puVar3[2];
      uVar29 = puVar3[3];
      puVar3 = out + uVar34 + 0xc;
      uVar30 = *puVar3;
      uVar31 = puVar3[1];
      uVar32 = puVar3[2];
      uVar33 = puVar3[3];
      puVar3 = out + uVar34;
      *puVar3 = *puVar2 + *puVar1;
      puVar3[1] = uVar19 + uVar4;
      puVar3[2] = uVar20 + uVar5;
      puVar3[3] = uVar21 + uVar6;
      puVar1 = out + uVar34 + 4;
      *puVar1 = uVar22 + uVar7;
      puVar1[1] = uVar23 + uVar8;
      puVar1[2] = uVar24 + uVar9;
      puVar1[3] = uVar25 + uVar10;
      puVar1 = out + uVar34 + 8;
      *puVar1 = uVar26 + uVar11;
      puVar1[1] = uVar27 + uVar12;
      puVar1[2] = uVar28 + uVar13;
      puVar1[3] = uVar29 + uVar14;
      puVar1 = out + uVar34 + 0xc;
      *puVar1 = uVar30 + uVar15;
      puVar1[1] = uVar31 + uVar16;
      puVar1[2] = uVar32 + uVar17;
      puVar1[3] = uVar33 + uVar18;
      uVar35 = uVar34 + 0x10;
      uVar36 = uVar34 + 0x20;
      uVar34 = uVar35;
    } while (uVar36 <= (uint)size);
  }
  if ((int)uVar35 < size) {
    uVar35 = uVar35 & 0xffffffff;
    do {
      out[uVar35] = out[uVar35] + a[uVar35];
      uVar35 = uVar35 + 1;
    } while ((uint)size != uVar35);
  }
  return;
}

Assistant:

static void AddVectorEq_SSE2(const uint32_t* a, uint32_t* out, int size) {
  int i;
  for (i = 0; i + LINE_SIZE <= size; i += LINE_SIZE) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)&a[i +  0]);
    const __m128i a1 = _mm_loadu_si128((const __m128i*)&a[i +  4]);
#if (LINE_SIZE == 16)
    const __m128i a2 = _mm_loadu_si128((const __m128i*)&a[i +  8]);
    const __m128i a3 = _mm_loadu_si128((const __m128i*)&a[i + 12]);
#endif
    const __m128i b0 = _mm_loadu_si128((const __m128i*)&out[i +  0]);
    const __m128i b1 = _mm_loadu_si128((const __m128i*)&out[i +  4]);
#if (LINE_SIZE == 16)
    const __m128i b2 = _mm_loadu_si128((const __m128i*)&out[i +  8]);
    const __m128i b3 = _mm_loadu_si128((const __m128i*)&out[i + 12]);
#endif
    _mm_storeu_si128((__m128i*)&out[i +  0], _mm_add_epi32(a0, b0));
    _mm_storeu_si128((__m128i*)&out[i +  4], _mm_add_epi32(a1, b1));
#if (LINE_SIZE == 16)
    _mm_storeu_si128((__m128i*)&out[i +  8], _mm_add_epi32(a2, b2));
    _mm_storeu_si128((__m128i*)&out[i + 12], _mm_add_epi32(a3, b3));
#endif
  }
  for (; i < size; ++i) {
    out[i] += a[i];
  }
}